

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::IsEndOfAlternative
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this)

{
  bool bVar1;
  EncodedChar EVar2;
  bool local_21;
  EncodedChar ec;
  Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this_local;
  
  EVar2 = ECLookahead(this,0);
  if ((EVar2 == L'\0') && (bVar1 = IsEOF(this), bVar1)) {
    return true;
  }
  local_21 = true;
  if ((EVar2 != L')') && (local_21 = true, EVar2 != L'|')) {
    local_21 = EVar2 == L'/';
  }
  return local_21;
}

Assistant:

inline bool Parser<P, IsLiteral>::IsEndOfAlternative()
    {
        EncodedChar ec = ECLookahead();
        // Could be terminating 0, but embedded 0 is part of alternative
        return (ec == 0 && IsEOF()) || ec == ')' || ec == '|' || (IsLiteral && ec == '/');
    }